

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceFile.cpp
# Opt level: O1

void __thiscall hdc::SourceFile::addDef(SourceFile *this,Def *def)

{
  pointer *pppDVar1;
  iterator __position;
  Def *local_10;
  
  __position._M_current =
       (this->defs).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_10 = def;
  if (__position._M_current ==
      (this->defs).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<hdc::Def*,std::allocator<hdc::Def*>>::_M_realloc_insert<hdc::Def*const&>
              ((vector<hdc::Def*,std::allocator<hdc::Def*>> *)&this->defs,__position,&local_10);
  }
  else {
    *__position._M_current = def;
    pppDVar1 = &(this->defs).super__Vector_base<hdc::Def_*,_std::allocator<hdc::Def_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppDVar1 = *pppDVar1 + 1;
  }
  Def::setFile(local_10,this);
  ASTNode::setParentNode(&local_10->super_ASTNode,&this->super_ASTNode);
  return;
}

Assistant:

void SourceFile::addDef(Def* def) {
    defs.push_back(def);
    def->setFile(this);
    def->setParentNode(this);
}